

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::compareEqual<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,wchar_t[6]>
               (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *lhs,wchar_t (*rhs) [6])

{
  size_t __n;
  wchar_t *__s1;
  int iVar1;
  size_t sVar2;
  size_type __rlen;
  bool bVar3;
  
  __n = lhs->_M_len;
  __s1 = lhs->_M_str;
  sVar2 = wcslen(*rhs);
  if (__n == sVar2) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = wmemcmp(__s1,*rhs,__n);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }